

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * create_lvar_init(C_Parser *parser,Initializer *init,C_Type *ty,InitDesg *desg,C_Token *tok)

{
  TypeKind TVar1;
  C_Member *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  long lVar6;
  InitDesg desg2;
  InitDesg local_58;
  Initializer *local_38;
  
  TVar1 = ty->kind;
  if (TVar1 == TY_UNION) {
    local_58.member = init->mem;
    if (local_58.member == (C_Member *)0x0) {
      local_58.member = ty->members;
    }
    local_58.idx = 0;
    local_58.var = (C_Obj *)0x0;
    local_58.next = desg;
    pCVar3 = create_lvar_init(parser,init->children[(local_58.member)->idx],(local_58.member)->ty,
                              &local_58,tok);
  }
  else {
    if (TVar1 == TY_STRUCT) {
      if (init->expr == (C_Node *)0x0) {
        pCVar3 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar3->kind = ND_NULL_EXPR;
        pCVar3->tok = tok;
        for (pCVar2 = ty->members; pCVar2 != (C_Member *)0x0; pCVar2 = pCVar2->next) {
          local_58.idx = 0;
          local_58.var = (C_Obj *)0x0;
          local_58.next = desg;
          local_58.member = pCVar2;
          pCVar4 = create_lvar_init(parser,init->children[pCVar2->idx],pCVar2->ty,&local_58,tok);
          pCVar5 = (C_Node *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          pCVar5->kind = ND_COMMA;
          pCVar5->tok = tok;
          pCVar5->lhs = pCVar3;
          pCVar5->rhs = pCVar4;
          pCVar3 = pCVar5;
        }
        return pCVar3;
      }
    }
    else if (TVar1 == TY_ARRAY) {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_NULL_EXPR;
      pCVar3->tok = tok;
      if (ty->array_len < 1) {
        return pCVar3;
      }
      lVar6 = 0;
      local_38 = init;
      do {
        local_58.idx = (int)lVar6;
        local_58.member = (C_Member *)0x0;
        local_58.var = (C_Obj *)0x0;
        local_58.next = desg;
        pCVar4 = create_lvar_init(parser,local_38->children[lVar6],ty->base,&local_58,tok);
        pCVar5 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar5->kind = ND_COMMA;
        pCVar5->tok = tok;
        pCVar5->lhs = pCVar3;
        pCVar5->rhs = pCVar4;
        lVar6 = lVar6 + 1;
        pCVar3 = pCVar5;
      } while (lVar6 < ty->array_len);
      return pCVar5;
    }
    if (init->expr == (C_Node *)0x0) {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_NULL_EXPR;
      pCVar3->tok = tok;
    }
    else {
      pCVar5 = init_desg_expr(parser,desg,tok);
      pCVar4 = init->expr;
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_ASSIGN;
      pCVar3->tok = tok;
      pCVar3->lhs = pCVar5;
      pCVar3->rhs = pCVar4;
    }
  }
  return pCVar3;
}

Assistant:

static C_Node *create_lvar_init(C_Parser *parser, Initializer *init, C_Type *ty, InitDesg *desg, C_Token *tok) {
  if (ty->kind == TY_ARRAY) {
    C_Node *node = new_node(parser, ND_NULL_EXPR, tok);
    for (int i = 0; i < ty->array_len; i++) {
      InitDesg desg2 = {desg, i};
      C_Node *rhs = create_lvar_init(parser, init->children[i], ty->base, &desg2, tok);
      node = new_binary(parser, ND_COMMA, node, rhs, tok);
    }
    return node;
  }

  if (ty->kind == TY_STRUCT && !init->expr) {
    C_Node *node = new_node(parser, ND_NULL_EXPR, tok);

    for (C_Member *mem = ty->members; mem; mem = mem->next) {
      InitDesg desg2 = {desg, 0, mem};
      C_Node *rhs = create_lvar_init(parser, init->children[mem->idx], mem->ty, &desg2, tok);
      node = new_binary(parser, ND_COMMA, node, rhs, tok);
    }
    return node;
  }

  if (ty->kind == TY_UNION) {
    C_Member *mem = init->mem ? init->mem : ty->members;
    InitDesg desg2 = {desg, 0, mem};
    return create_lvar_init(parser, init->children[mem->idx], mem->ty, &desg2, tok);
  }

  if (!init->expr)
    return new_node(parser, ND_NULL_EXPR, tok);

  C_Node *lhs = init_desg_expr(parser, desg, tok);
  return new_binary(parser, ND_ASSIGN, lhs, init->expr, tok);
}